

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O3

Ops * __thiscall
miniscript::Node<XOnlyPubKey>::CalcOps(Ops *__return_storage_ptr__,Node<XOnlyPubKey> *this)

{
  char cVar1;
  uint32_t uVar2;
  pointer psVar3;
  element_type *peVar4;
  element_type *peVar5;
  bool bVar6;
  bool bVar7;
  pointer pMVar8;
  pointer pMVar9;
  uint uVar10;
  MaxInt<unsigned_int> MVar11;
  element_type *peVar12;
  MaxInt<unsigned_int> MVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  MaxInt<unsigned_int> MVar18;
  pointer psVar19;
  ulong uVar20;
  MaxInt<unsigned_int> MVar21;
  MaxInt<unsigned_int> MVar22;
  MaxInt<unsigned_int> MVar23;
  MaxInt<unsigned_int> MVar24;
  MaxInt<unsigned_int> MVar25;
  byte bVar26;
  MaxInt<unsigned_int> MVar27;
  uint32_t uVar28;
  long in_FS_OFFSET;
  vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
  next_sats;
  vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
  ret;
  MaxInt<unsigned_int> local_80;
  MaxInt<unsigned_int> local_78;
  pointer pMStack_70;
  pointer local_68;
  vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
  local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  switch(this->fragment) {
  case JUST_0:
    __return_storage_ptr__->count = 0;
    (__return_storage_ptr__->sat).valid = false;
    *(undefined3 *)&(__return_storage_ptr__->sat).field_0x1 = 0;
    (__return_storage_ptr__->sat).value = 0;
    goto LAB_001980c5;
  case JUST_1:
    __return_storage_ptr__->count = 0;
    goto LAB_00198018;
  case PK_K:
    __return_storage_ptr__->count = 0;
    goto LAB_0019816f;
  case PK_H:
    __return_storage_ptr__->count = 3;
    goto LAB_0019816f;
  case OLDER:
  case AFTER:
    __return_storage_ptr__->count = 1;
    goto LAB_00198018;
  case SHA256:
  case HASH256:
  case RIPEMD160:
  case HASH160:
    __return_storage_ptr__->count = 4;
LAB_00198018:
    (__return_storage_ptr__->sat).valid = true;
    *(undefined3 *)&(__return_storage_ptr__->sat).field_0x1 = 0;
    (__return_storage_ptr__->sat).value = 0;
    break;
  case WRAP_A:
    peVar12 = (((this->subs).
                super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    uVar28 = (peVar12->ops).count + 2;
    goto LAB_00197e56;
  case WRAP_S:
  case WRAP_C:
  case WRAP_N:
    peVar12 = (((this->subs).
                super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    uVar28 = (peVar12->ops).count + 1;
LAB_00197e56:
    MVar11 = *(MaxInt<unsigned_int> *)((long)&peVar12->ops + 4);
    MVar24 = *(MaxInt<unsigned_int> *)((long)&peVar12->ops + 0xc);
    __return_storage_ptr__->count = uVar28;
    __return_storage_ptr__->sat = MVar11;
    __return_storage_ptr__->dsat = MVar24;
    goto LAB_00198399;
  case WRAP_D:
    peVar12 = (((this->subs).
                super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    uVar28 = (peVar12->ops).count + 3;
    goto LAB_001980bb;
  case WRAP_V:
    peVar12 = (((this->subs).
                super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    MVar11 = *(MaxInt<unsigned_int> *)((long)&peVar12->ops + 4);
    __return_storage_ptr__->count =
         (peVar12->ops).count + (uint)(((peVar12->typ).m_flags >> 0xd & 1) != 0);
    __return_storage_ptr__->sat = MVar11;
    break;
  case WRAP_J:
    peVar12 = (((this->subs).
                super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    uVar28 = (peVar12->ops).count + 4;
LAB_001980bb:
    MVar11 = *(MaxInt<unsigned_int> *)((long)&peVar12->ops + 4);
    __return_storage_ptr__->count = uVar28;
    __return_storage_ptr__->sat = MVar11;
LAB_001980c5:
    (__return_storage_ptr__->dsat).valid = true;
    *(undefined3 *)&(__return_storage_ptr__->dsat).field_0x1 = 0;
    (__return_storage_ptr__->dsat).value = 0;
    goto LAB_00198399;
  case AND_V:
    psVar19 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar12 = (psVar19->
              super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    peVar4 = psVar19[1].
             super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if ((((MaxInt<unsigned_int> *)((long)&peVar12->ops + 4))->valid == true) &&
       (((MaxInt<unsigned_int> *)((long)&peVar4->ops + 4))->valid == true)) {
      uVar14 = (ulong)(*(uint *)((long)&peVar4->ops + 8) + *(uint *)((long)&peVar12->ops + 8)) <<
               0x20;
      uVar17 = 1;
    }
    else {
      uVar14 = 0;
      uVar17 = 0;
    }
    __return_storage_ptr__->count = (peVar4->ops).count + (peVar12->ops).count;
    __return_storage_ptr__->sat = (MaxInt<unsigned_int>)(uVar14 | uVar17);
    break;
  case AND_B:
    psVar19 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar12 = (psVar19->
              super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    peVar4 = psVar19[1].
             super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if ((((MaxInt<unsigned_int> *)((long)&peVar12->ops + 4))->valid == true) &&
       (((MaxInt<unsigned_int> *)((long)&peVar4->ops + 4))->valid == true)) {
      uVar14 = (ulong)(*(uint *)((long)&peVar4->ops + 8) + *(uint *)((long)&peVar12->ops + 8)) <<
               0x20;
      uVar17 = 1;
    }
    else {
      uVar14 = 0;
      uVar17 = 0;
    }
    if ((((MaxInt<unsigned_int> *)((long)&peVar12->ops + 0xc))->valid == true) &&
       (((MaxInt<unsigned_int> *)((long)&peVar4->ops + 0xc))->valid == true)) {
      uVar15 = (ulong)(*(uint *)((long)&peVar4->ops + 0x10) + *(uint *)((long)&peVar12->ops + 0x10))
               << 0x20;
      uVar20 = 1;
    }
    else {
      uVar15 = 0;
      uVar20 = 0;
    }
    __return_storage_ptr__->count = (peVar12->ops).count + (peVar4->ops).count + 1;
    __return_storage_ptr__->sat = (MaxInt<unsigned_int>)(uVar14 | uVar17);
    __return_storage_ptr__->dsat = (MaxInt<unsigned_int>)(uVar15 | uVar20);
    goto LAB_00198399;
  case OR_B:
    psVar19 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar12 = (psVar19->
              super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    peVar4 = psVar19[1].
             super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    uVar10 = 0;
    uVar16 = 0;
    bVar26 = 0;
    if ((((MaxInt<unsigned_int> *)((long)&peVar12->ops + 4))->valid == true) &&
       (uVar16 = 0, ((MaxInt<unsigned_int> *)((long)&peVar4->ops + 0xc))->valid == true)) {
      uVar16 = *(uint *)((long)&peVar4->ops + 0x10) + *(uint *)((long)&peVar12->ops + 8);
      bVar26 = 1;
    }
    bVar6 = false;
    if ((((MaxInt<unsigned_int> *)((long)&peVar4->ops + 4))->valid == true) &&
       (uVar10 = 0, ((MaxInt<unsigned_int> *)((long)&peVar12->ops + 0xc))->valid == true)) {
      uVar10 = *(uint *)((long)&peVar12->ops + 0x10) + *(uint *)((long)&peVar4->ops + 8);
      bVar6 = true;
    }
    if (bVar26 == 0) {
      uVar14 = (ulong)uVar10 << 0x20;
      uVar17 = (ulong)bVar6;
    }
    else if (bVar6) {
      if (uVar10 < uVar16) {
        uVar10 = uVar16;
      }
      uVar14 = (ulong)uVar10 << 0x20;
      uVar17 = 1;
    }
    else {
      uVar14 = (ulong)uVar16 << 0x20;
      uVar17 = (ulong)bVar26;
    }
    if ((((MaxInt<unsigned_int> *)((long)&peVar12->ops + 0xc))->valid == true) &&
       (((MaxInt<unsigned_int> *)((long)&peVar4->ops + 0xc))->valid == true)) {
      uVar15 = (ulong)(*(uint *)((long)&peVar4->ops + 0x10) + *(uint *)((long)&peVar12->ops + 0x10))
               << 0x20;
      uVar20 = 1;
    }
    else {
      uVar15 = 0;
      uVar20 = 0;
    }
    MVar11 = (MaxInt<unsigned_int>)(uVar15 | uVar20);
    __return_storage_ptr__->count = (peVar12->ops).count + (peVar4->ops).count + 1;
    __return_storage_ptr__->sat = (MaxInt<unsigned_int>)(uVar14 | uVar17);
    goto LAB_00198395;
  case OR_C:
    psVar19 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar12 = (psVar19->
              super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    peVar4 = psVar19[1].
             super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    uVar14 = 0;
    bVar6 = false;
    if (((MaxInt<unsigned_int> *)((long)&peVar4->ops + 4))->valid == true) {
      uVar14 = 0;
      bVar6 = false;
      if (((MaxInt<unsigned_int> *)((long)&peVar12->ops + 0xc))->valid == true) {
        uVar14 = (ulong)(*(uint *)((long)&peVar12->ops + 0x10) + *(uint *)((long)&peVar4->ops + 8));
        bVar6 = true;
      }
    }
    if (((MaxInt<unsigned_int> *)((long)&peVar12->ops + 4))->valid == false) {
      MVar18._1_7_ = 0;
      MVar18.valid = bVar6;
      MVar22 = MVar18;
    }
    else if (bVar6) {
      uVar10 = *(uint *)((long)&peVar12->ops + 8);
      if ((uint)uVar14 < uVar10) {
        uVar14 = (ulong)uVar10;
      }
      MVar22.valid = true;
      MVar22._1_3_ = 0;
      MVar22.value = 0;
      MVar18.valid = false;
      MVar18._1_3_ = 0;
      MVar18.value = 0;
    }
    else {
      MVar18 = *(MaxInt<unsigned_int> *)((long)&peVar12->ops + 4);
      uVar14 = (ulong)MVar18 >> 0x20;
      MVar22 = (MaxInt<unsigned_int>)((ulong)MVar18 & 0xff);
    }
    __return_storage_ptr__->count = (peVar12->ops).count + (peVar4->ops).count + 2;
    __return_storage_ptr__->sat =
         (MaxInt<unsigned_int>)((ulong)(MVar18._0_4_ & 0xffffff00) | uVar14 << 0x20 | (ulong)MVar22)
    ;
    break;
  case OR_D:
    psVar19 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar12 = (psVar19->
              super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    peVar4 = psVar19[1].
             super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    uVar14 = 0;
    bVar6 = false;
    if (((MaxInt<unsigned_int> *)((long)&peVar4->ops + 4))->valid == true) {
      uVar14 = 0;
      bVar6 = false;
      if (((MaxInt<unsigned_int> *)((long)&peVar12->ops + 0xc))->valid == true) {
        uVar14 = (ulong)(*(uint *)((long)&peVar12->ops + 0x10) + *(uint *)((long)&peVar4->ops + 8));
        bVar6 = true;
      }
    }
    if (((MaxInt<unsigned_int> *)((long)&peVar12->ops + 4))->valid == false) {
      MVar21._1_7_ = 0;
      MVar21.valid = bVar6;
      MVar23 = MVar21;
    }
    else if (bVar6) {
      uVar10 = *(uint *)((long)&peVar12->ops + 8);
      if ((uint)uVar14 < uVar10) {
        uVar14 = (ulong)uVar10;
      }
      MVar23.valid = true;
      MVar23._1_3_ = 0;
      MVar23.value = 0;
      MVar21.valid = false;
      MVar21._1_3_ = 0;
      MVar21.value = 0;
    }
    else {
      MVar21 = *(MaxInt<unsigned_int> *)((long)&peVar12->ops + 4);
      uVar14 = (ulong)MVar21 >> 0x20;
      MVar23 = (MaxInt<unsigned_int>)((ulong)MVar21 & 0xff);
    }
    MVar23 = (MaxInt<unsigned_int>)
             ((ulong)(MVar21._0_4_ & 0xffffff00) | uVar14 << 0x20 | (ulong)MVar23);
    if ((((MaxInt<unsigned_int> *)((long)&peVar12->ops + 0xc))->valid == true) &&
       (((MaxInt<unsigned_int> *)((long)&peVar4->ops + 0xc))->valid == true)) {
      uVar17 = (ulong)(*(uint *)((long)&peVar4->ops + 0x10) + *(uint *)((long)&peVar12->ops + 0x10))
               << 0x20;
      uVar14 = 1;
    }
    else {
      uVar17 = 0;
      uVar14 = 0;
    }
    MVar11 = (MaxInt<unsigned_int>)(uVar17 | uVar14);
    __return_storage_ptr__->count = (peVar12->ops).count + (peVar4->ops).count + 3;
    goto LAB_001982f5;
  case OR_I:
    psVar19 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar12 = (psVar19->
              super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    peVar4 = psVar19[1].
             super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (((MaxInt<unsigned_int> *)((long)&peVar12->ops + 4))->valid == false) {
      MVar24 = *(MaxInt<unsigned_int> *)((long)&peVar4->ops + 4);
LAB_00198289:
      uVar14 = (ulong)MVar24 >> 0x20;
      MVar27 = MVar24;
    }
    else {
      if (((MaxInt<unsigned_int> *)((long)&peVar4->ops + 4))->valid == false) {
        MVar24 = *(MaxInt<unsigned_int> *)((long)&peVar12->ops + 4);
        goto LAB_00198289;
      }
      uVar10 = *(uint *)((long)&peVar12->ops + 8);
      uVar16 = *(uint *)((long)&peVar4->ops + 8);
      if (uVar16 < uVar10) {
        uVar16 = uVar10;
      }
      uVar14 = (ulong)uVar16;
      MVar27.valid = true;
      MVar27._1_3_ = 0;
      MVar27.value = 0;
      MVar24.valid = false;
      MVar24._1_3_ = 0;
      MVar24.value = 0;
    }
    MVar23 = (MaxInt<unsigned_int>)
             ((ulong)MVar27 & 0xff | (ulong)(MVar24._0_4_ & 0xffffff00) | uVar14 << 0x20);
    if (((MaxInt<unsigned_int> *)((long)&peVar12->ops + 0xc))->valid == false) {
      MVar13 = *(MaxInt<unsigned_int> *)((long)&peVar4->ops + 0xc);
LAB_001982d6:
      uVar14 = (ulong)MVar13 >> 0x20;
      MVar25 = MVar13;
    }
    else {
      if (((MaxInt<unsigned_int> *)((long)&peVar4->ops + 0xc))->valid == false) {
        MVar13 = *(MaxInt<unsigned_int> *)((long)&peVar12->ops + 0xc);
        goto LAB_001982d6;
      }
      uVar10 = *(uint *)((long)&peVar12->ops + 0x10);
      uVar16 = *(uint *)((long)&peVar4->ops + 0x10);
      if (uVar16 < uVar10) {
        uVar16 = uVar10;
      }
      uVar14 = (ulong)uVar16;
      MVar25.valid = true;
      MVar25._1_3_ = 0;
      MVar25.value = 0;
      MVar13.valid = false;
      MVar13._1_3_ = 0;
      MVar13.value = 0;
    }
    MVar11 = (MaxInt<unsigned_int>)
             ((ulong)MVar25 & 0xff | (ulong)(MVar13._0_4_ & 0xffffff00) | uVar14 << 0x20);
    __return_storage_ptr__->count = (peVar12->ops).count + (peVar4->ops).count + 3;
LAB_001982f5:
    __return_storage_ptr__->sat = MVar23;
    goto LAB_00198395;
  case ANDOR:
    psVar19 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar12 = (psVar19->
              super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    peVar4 = psVar19[1].
             super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    peVar5 = psVar19[2].
             super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    uVar10 = 0;
    uVar16 = 0;
    bVar26 = 0;
    if ((((MaxInt<unsigned_int> *)((long)&peVar4->ops + 4))->valid == true) &&
       (uVar16 = 0, ((MaxInt<unsigned_int> *)((long)&peVar12->ops + 4))->valid == true)) {
      uVar16 = *(uint *)((long)&peVar12->ops + 8) + *(uint *)((long)&peVar4->ops + 8);
      bVar26 = 1;
    }
    cVar1 = ((MaxInt<unsigned_int> *)((long)&peVar12->ops + 0xc))->valid;
    bVar6 = false;
    if ((cVar1 == '\x01') &&
       (uVar10 = 0, ((MaxInt<unsigned_int> *)((long)&peVar5->ops + 4))->valid == true)) {
      uVar10 = *(uint *)((long)&peVar5->ops + 8) + *(uint *)((long)&peVar12->ops + 0x10);
      bVar6 = true;
    }
    if (bVar26 == 0) {
      uVar14 = (ulong)uVar10 << 0x20;
      uVar17 = (ulong)bVar6;
    }
    else if (bVar6) {
      if (uVar10 < uVar16) {
        uVar10 = uVar16;
      }
      uVar14 = (ulong)uVar10 << 0x20;
      uVar17 = 1;
    }
    else {
      uVar14 = (ulong)uVar16 << 0x20;
      uVar17 = (ulong)bVar26;
    }
    if ((cVar1 == '\0') || (((MaxInt<unsigned_int> *)((long)&peVar5->ops + 0xc))->valid != true)) {
      uVar15 = 0;
      uVar20 = 0;
    }
    else {
      uVar15 = (ulong)(*(uint *)((long)&peVar5->ops + 0x10) + *(uint *)((long)&peVar12->ops + 0x10))
               << 0x20;
      uVar20 = 1;
    }
    MVar11 = (MaxInt<unsigned_int>)(uVar15 | uVar20);
    __return_storage_ptr__->count =
         (peVar12->ops).count + (peVar4->ops).count + (peVar5->ops).count + 3;
    __return_storage_ptr__->sat = (MaxInt<unsigned_int>)(uVar14 | uVar17);
LAB_00198395:
    __return_storage_ptr__->dsat = MVar11;
    goto LAB_00198399;
  case THRESH:
    local_78.valid = true;
    local_78 = (MaxInt<unsigned_int>)((ulong)local_78 & 0xffffffff);
    local_58.
    super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ::reserve(&local_58,1);
    std::
    vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
    ::emplace_back<miniscript::internal::MaxInt<unsigned_int>>
              ((vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
                *)&local_58,&local_78);
    psVar19 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar3 = (this->subs).
             super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar28 = 0;
    if (psVar19 != psVar3) {
      do {
        peVar12 = (psVar19->
                  super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr;
        if (((local_58.
              super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->valid == '\x01') &&
           ((peVar12->ops).dsat.valid == true)) {
          uVar14 = (ulong)((peVar12->ops).dsat.value +
                          *(uint *)((long)local_58.
                                          super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + 4)) << 0x20;
          uVar17 = 1;
        }
        else {
          uVar14 = 0;
          uVar17 = 0;
        }
        local_80 = (MaxInt<unsigned_int>)(uVar14 | uVar17);
        uVar2 = (peVar12->ops).count;
        local_78.valid = false;
        local_78._1_3_ = 0;
        local_78.value = 0;
        pMStack_70 = (pointer)0x0;
        local_68 = (pointer)0x0;
        std::
        vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
        ::reserve((vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                   *)&local_78,1);
        std::
        vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
        ::emplace_back<miniscript::internal::MaxInt<unsigned_int>>
                  ((vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
                    *)&local_78,&local_80);
        uVar14 = (long)local_58.
                       super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_58.
                       super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        if (8 < uVar14) {
          uVar17 = 1;
          do {
            peVar12 = (psVar19->
                      super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr;
            uVar10 = 0;
            uVar16 = 0;
            bVar6 = false;
            if ((((MaxInt<unsigned_int> *)
                 ((long)local_58.
                        super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar17 * 8))->valid == true) &&
               (uVar16 = 0, (peVar12->ops).dsat.valid == true)) {
              uVar16 = (peVar12->ops).dsat.value +
                       ((uint *)((long)local_58.
                                       super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 4))[uVar17 * 2];
              bVar6 = true;
            }
            bVar7 = false;
            if ((((MaxInt<unsigned_int> *)
                 ((long)local_58.
                        super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + -8))[uVar17].valid == true) &&
               (uVar10 = 0, (peVar12->ops).sat.valid == true)) {
              uVar10 = (peVar12->ops).sat.value +
                       ((uint *)((long)local_58.
                                       super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + -4))[uVar17 * 2];
              bVar7 = true;
            }
            if (bVar6) {
              if (bVar7) {
                if (uVar10 < uVar16) {
                  uVar10 = uVar16;
                }
                uVar14 = (ulong)uVar10 << 0x20;
                uVar20 = 1;
              }
              else {
                uVar14 = (ulong)uVar16 << 0x20;
                uVar20 = (ulong)bVar6;
              }
            }
            else {
              uVar14 = (ulong)uVar10 << 0x20;
              uVar20 = (ulong)bVar7;
            }
            local_80 = (MaxInt<unsigned_int>)(uVar14 | uVar20);
            std::
            vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
            ::emplace_back<miniscript::internal::MaxInt<unsigned_int>>
                      ((vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
                        *)&local_78,&local_80);
            uVar17 = uVar17 + 1;
            uVar14 = (long)local_58.
                           super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_58.
                           super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
          } while (uVar17 < (ulong)((long)uVar14 >> 3));
        }
        if (((&((MaxInt<unsigned_int> *)
               ((long)local_58.
                      super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + -8))->valid)[uVar14] == true) &&
           (peVar12 = (psVar19->
                      super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr, (peVar12->ops).sat.valid == true)) {
          uVar17 = (ulong)((peVar12->ops).sat.value +
                          *(int *)((long)((long)local_58.
                                                super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start + -4) +
                                  uVar14)) << 0x20;
          uVar14 = 1;
        }
        else {
          uVar17 = 0;
          uVar14 = 0;
        }
        local_80 = (MaxInt<unsigned_int>)(uVar17 | uVar14);
        std::
        vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
        ::emplace_back<miniscript::internal::MaxInt<unsigned_int>>
                  ((vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
                    *)&local_78,&local_80);
        pMVar9 = local_58.
                 super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pMVar8 = local_58.
                 super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_58.
        super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_78;
        local_58.
        super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pMStack_70;
        local_58.
        super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = local_68;
        local_78.valid = false;
        local_78._1_3_ = 0;
        local_78.value = 0;
        pMStack_70 = (pointer)0x0;
        local_68 = (pointer)0x0;
        if (((MaxInt<unsigned_int>)pMVar8 != (MaxInt<unsigned_int>)0x0) &&
           (operator_delete(pMVar8,(long)pMVar9 - (long)pMVar8),
           local_78 != (MaxInt<unsigned_int>)0x0)) {
          operator_delete((void *)local_78,(long)local_68 - (long)local_78);
        }
        uVar28 = uVar28 + uVar2 + 1;
        psVar19 = psVar19 + 1;
      } while (psVar19 != psVar3);
    }
    if ((ulong)((long)local_58.
                      super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_58.
                      super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) < (ulong)this->k) {
      __assert_fail("k <= sats.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h"
                    ,0x3db,
                    "internal::Ops miniscript::Node<XOnlyPubKey>::CalcOps() const [Key = XOnlyPubKey]"
                   );
    }
    MVar11 = *(MaxInt<unsigned_int> *)
              ((long)local_58.
                     super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + (ulong)this->k * 8);
    MVar24 = *local_58.
              super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    __return_storage_ptr__->count = uVar28;
    __return_storage_ptr__->sat = MVar11;
    __return_storage_ptr__->dsat = MVar24;
    operator_delete(local_58.
                    super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    goto LAB_00198399;
  case MULTI:
    MVar11 = (MaxInt<unsigned_int>)
             (((long)(this->keys).super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->keys).super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>.
                     _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffffe0U) * 0x8000000 + 1
             );
    __return_storage_ptr__->count = 1;
    goto LAB_00198174;
  case MULTI_A:
    __return_storage_ptr__->count =
         (int)((ulong)((long)(this->keys).
                             super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(this->keys).
                            super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 5) + 1;
LAB_0019816f:
    MVar11.valid = true;
    MVar11._1_3_ = 0;
    MVar11.value = 0;
LAB_00198174:
    __return_storage_ptr__->sat = MVar11;
    __return_storage_ptr__->dsat = MVar11;
    goto LAB_00198399;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h"
                  ,0x3df,
                  "internal::Ops miniscript::Node<XOnlyPubKey>::CalcOps() const [Key = XOnlyPubKey]"
                 );
  }
  (__return_storage_ptr__->dsat).valid = false;
  *(undefined3 *)&(__return_storage_ptr__->dsat).field_0x1 = 0;
  (__return_storage_ptr__->dsat).value = 0;
LAB_00198399:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

internal::Ops CalcOps() const {
        switch (fragment) {
            case Fragment::JUST_1: return {0, 0, {}};
            case Fragment::JUST_0: return {0, {}, 0};
            case Fragment::PK_K: return {0, 0, 0};
            case Fragment::PK_H: return {3, 0, 0};
            case Fragment::OLDER:
            case Fragment::AFTER: return {1, 0, {}};
            case Fragment::SHA256:
            case Fragment::RIPEMD160:
            case Fragment::HASH256:
            case Fragment::HASH160: return {4, 0, {}};
            case Fragment::AND_V: return {subs[0]->ops.count + subs[1]->ops.count, subs[0]->ops.sat + subs[1]->ops.sat, {}};
            case Fragment::AND_B: {
                const auto count{1 + subs[0]->ops.count + subs[1]->ops.count};
                const auto sat{subs[0]->ops.sat + subs[1]->ops.sat};
                const auto dsat{subs[0]->ops.dsat + subs[1]->ops.dsat};
                return {count, sat, dsat};
            }
            case Fragment::OR_B: {
                const auto count{1 + subs[0]->ops.count + subs[1]->ops.count};
                const auto sat{(subs[0]->ops.sat + subs[1]->ops.dsat) | (subs[1]->ops.sat + subs[0]->ops.dsat)};
                const auto dsat{subs[0]->ops.dsat + subs[1]->ops.dsat};
                return {count, sat, dsat};
            }
            case Fragment::OR_D: {
                const auto count{3 + subs[0]->ops.count + subs[1]->ops.count};
                const auto sat{subs[0]->ops.sat | (subs[1]->ops.sat + subs[0]->ops.dsat)};
                const auto dsat{subs[0]->ops.dsat + subs[1]->ops.dsat};
                return {count, sat, dsat};
            }
            case Fragment::OR_C: {
                const auto count{2 + subs[0]->ops.count + subs[1]->ops.count};
                const auto sat{subs[0]->ops.sat | (subs[1]->ops.sat + subs[0]->ops.dsat)};
                return {count, sat, {}};
            }
            case Fragment::OR_I: {
                const auto count{3 + subs[0]->ops.count + subs[1]->ops.count};
                const auto sat{subs[0]->ops.sat | subs[1]->ops.sat};
                const auto dsat{subs[0]->ops.dsat | subs[1]->ops.dsat};
                return {count, sat, dsat};
            }
            case Fragment::ANDOR: {
                const auto count{3 + subs[0]->ops.count + subs[1]->ops.count + subs[2]->ops.count};
                const auto sat{(subs[1]->ops.sat + subs[0]->ops.sat) | (subs[0]->ops.dsat + subs[2]->ops.sat)};
                const auto dsat{subs[0]->ops.dsat + subs[2]->ops.dsat};
                return {count, sat, dsat};
            }
            case Fragment::MULTI: return {1, (uint32_t)keys.size(), (uint32_t)keys.size()};
            case Fragment::MULTI_A: return {(uint32_t)keys.size() + 1, 0, 0};
            case Fragment::WRAP_S:
            case Fragment::WRAP_C:
            case Fragment::WRAP_N: return {1 + subs[0]->ops.count, subs[0]->ops.sat, subs[0]->ops.dsat};
            case Fragment::WRAP_A: return {2 + subs[0]->ops.count, subs[0]->ops.sat, subs[0]->ops.dsat};
            case Fragment::WRAP_D: return {3 + subs[0]->ops.count, subs[0]->ops.sat, 0};
            case Fragment::WRAP_J: return {4 + subs[0]->ops.count, subs[0]->ops.sat, 0};
            case Fragment::WRAP_V: return {subs[0]->ops.count + (subs[0]->GetType() << "x"_mst), subs[0]->ops.sat, {}};
            case Fragment::THRESH: {
                uint32_t count = 0;
                auto sats = Vector(internal::MaxInt<uint32_t>(0));
                for (const auto& sub : subs) {
                    count += sub->ops.count + 1;
                    auto next_sats = Vector(sats[0] + sub->ops.dsat);
                    for (size_t j = 1; j < sats.size(); ++j) next_sats.push_back((sats[j] + sub->ops.dsat) | (sats[j - 1] + sub->ops.sat));
                    next_sats.push_back(sats[sats.size() - 1] + sub->ops.sat);
                    sats = std::move(next_sats);
                }
                assert(k <= sats.size());
                return {count, sats[k], sats[0]};
            }
        }
        assert(false);
    }